

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

void __thiscall
QWidgetTextControl::QWidgetTextControl(QWidgetTextControl *this,QTextDocument *doc,QObject *parent)

{
  QWidgetTextControlPrivate *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QWidgetTextControlPrivate *)operator_new(0x1b0);
  QWidgetTextControlPrivate::QWidgetTextControlPrivate(this_00);
  QInputControl::QInputControl((QInputControl *)this,TextEdit,(QObjectPrivate *)this_00,parent);
  *(undefined ***)this = &PTR_metaObject_007d90d0;
  local_48.d = (Data *)0x0;
  local_48.ptr = (char16_t *)0x0;
  local_48.size = 0;
  QWidgetTextControlPrivate::init(*(QWidgetTextControlPrivate **)(this + 8),(EVP_PKEY_CTX *)0x1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QWidgetTextControl::QWidgetTextControl(QTextDocument *doc, QObject *parent)
    : QInputControl(QInputControl::TextEdit, *new QWidgetTextControlPrivate, parent)
{
    Q_D(QWidgetTextControl);
    d->init(Qt::RichText, QString(), doc);
}